

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  undefined4 uVar39;
  ulong unaff_R15;
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar59 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  vfloat<8> tNear;
  vint8 bi;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined4 uStack_24f0;
  undefined4 uStack_24ec;
  undefined4 uStack_24e8;
  undefined4 uStack_24e4;
  undefined4 local_24e0;
  undefined4 uStack_24dc;
  undefined4 uStack_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar56 [64];
  undefined1 auVar58 [64];
  undefined1 auVar60 [64];
  
  pauVar36 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  local_2480 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_24a0 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_24c0 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_24e0 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_24dc = local_24e0;
  uStack_24d8 = local_24e0;
  uStack_24d4 = local_24e0;
  uStack_24d0 = local_24e0;
  uStack_24cc = local_24e0;
  uStack_24c8 = local_24e0;
  uStack_24c4 = local_24e0;
  local_2500 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_24fc = local_2500;
  uStack_24f8 = local_2500;
  uStack_24f4 = local_2500;
  uStack_24f0 = local_2500;
  uStack_24ec = local_2500;
  uStack_24e8 = local_2500;
  uStack_24e4 = local_2500;
  local_2520 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_251c = local_2520;
  fStack_2518 = local_2520;
  fStack_2514 = local_2520;
  fStack_2510 = local_2520;
  fStack_250c = local_2520;
  fStack_2508 = local_2520;
  fStack_2504 = local_2520;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2540._4_4_ = fVar1;
  local_2540._0_4_ = fVar1;
  local_2540._8_4_ = fVar1;
  local_2540._12_4_ = fVar1;
  local_2540._16_4_ = fVar1;
  local_2540._20_4_ = fVar1;
  local_2540._24_4_ = fVar1;
  local_2540._28_4_ = fVar1;
  auVar50 = ZEXT3264(local_2540);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2560._4_4_ = fVar2;
  local_2560._0_4_ = fVar2;
  local_2560._8_4_ = fVar2;
  local_2560._12_4_ = fVar2;
  local_2560._16_4_ = fVar2;
  local_2560._20_4_ = fVar2;
  local_2560._24_4_ = fVar2;
  local_2560._28_4_ = fVar2;
  auVar51 = ZEXT3264(local_2560);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2580._4_4_ = fVar3;
  local_2580._0_4_ = fVar3;
  local_2580._8_4_ = fVar3;
  local_2580._12_4_ = fVar3;
  local_2580._16_4_ = fVar3;
  local_2580._20_4_ = fVar3;
  local_2580._24_4_ = fVar3;
  local_2580._28_4_ = fVar3;
  auVar52 = ZEXT3264(local_2580);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar25 = (tray->tnear).field_0.i[k];
  local_25a0._4_4_ = iVar25;
  local_25a0._0_4_ = iVar25;
  local_25a0._8_4_ = iVar25;
  local_25a0._12_4_ = iVar25;
  local_25a0._16_4_ = iVar25;
  local_25a0._20_4_ = iVar25;
  local_25a0._24_4_ = iVar25;
  local_25a0._28_4_ = iVar25;
  auVar53 = ZEXT3264(local_25a0);
  iVar25 = (tray->tfar).field_0.i[k];
  auVar40 = ZEXT3264(CONCAT428(iVar25,CONCAT424(iVar25,CONCAT420(iVar25,CONCAT416(iVar25,CONCAT412(
                                                  iVar25,CONCAT48(iVar25,CONCAT44(iVar25,iVar25)))))
                                               )));
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  auVar57._0_4_ = fVar1 * -local_2480;
  auVar57._4_4_ = fVar1 * -local_2480;
  auVar57._8_4_ = fVar1 * -local_2480;
  auVar57._12_4_ = fVar1 * -local_2480;
  auVar57._16_4_ = fVar1 * -local_2480;
  auVar57._20_4_ = fVar1 * -local_2480;
  auVar57._28_36_ = in_ZMM10._28_36_;
  auVar57._24_4_ = fVar1 * -local_2480;
  auVar56 = ZEXT3264(auVar57._0_32_);
  fStack_249c = local_24a0;
  fStack_2498 = local_24a0;
  fStack_2494 = local_24a0;
  fStack_2490 = local_24a0;
  fStack_248c = local_24a0;
  fStack_2488 = local_24a0;
  fStack_2484 = local_24a0;
  auVar59._0_4_ = fVar2 * -local_24a0;
  auVar59._4_4_ = fVar2 * -local_24a0;
  auVar59._8_4_ = fVar2 * -local_24a0;
  auVar59._12_4_ = fVar2 * -local_24a0;
  auVar59._16_4_ = fVar2 * -local_24a0;
  auVar59._20_4_ = fVar2 * -local_24a0;
  auVar59._28_36_ = in_ZMM11._28_36_;
  auVar59._24_4_ = fVar2 * -local_24a0;
  auVar58 = ZEXT3264(auVar59._0_32_);
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  auVar61._0_4_ = fVar3 * -local_24c0;
  auVar61._4_4_ = fVar3 * -local_24c0;
  auVar61._8_4_ = fVar3 * -local_24c0;
  auVar61._12_4_ = fVar3 * -local_24c0;
  auVar61._16_4_ = fVar3 * -local_24c0;
  auVar61._20_4_ = fVar3 * -local_24c0;
  auVar61._28_36_ = in_ZMM12._28_36_;
  auVar61._24_4_ = fVar3 * -local_24c0;
  auVar60 = ZEXT3264(auVar61._0_32_);
  local_25c0 = auVar57._0_32_;
  local_25e0 = auVar59._0_32_;
  local_2600 = auVar61._0_32_;
  do {
    do {
      if (pauVar36 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar37 = pauVar36 + -1;
      pauVar36 = pauVar36 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar37 + 8));
    uVar34 = *(ulong *)*pauVar36;
    do {
      if ((uVar34 & 8) == 0) {
        fVar1 = *(float *)(ray + k * 4 + 0x70);
        uVar27 = (uint)uVar34 & 7;
        uVar26 = uVar34 & 0xfffffffffffffff0;
        if (uVar27 == 3) {
          local_2400 = *(undefined1 (*) [32])(uVar26 + 0x40);
          local_23e0 = *(undefined1 (*) [32])(uVar26 + 0x60);
          local_2420 = *(undefined1 (*) [32])(uVar26 + 0xa0);
          local_23c0 = *(undefined1 (*) [32])(uVar26 + 0xc0);
          local_2440 = *(undefined1 (*) [32])(uVar26 + 0xe0);
          auVar10 = *(undefined1 (*) [32])(uVar26 + 0x100);
          auVar11 = *(undefined1 (*) [32])(uVar26 + 0x120);
          auVar12 = *(undefined1 (*) [32])(uVar26 + 0x140);
          fVar2 = 1.0 - fVar1;
          auVar63._4_4_ = fVar2;
          auVar63._0_4_ = fVar2;
          auVar63._8_4_ = fVar2;
          auVar63._12_4_ = fVar2;
          auVar63._16_4_ = fVar2;
          auVar63._20_4_ = fVar2;
          auVar63._24_4_ = fVar2;
          auVar63._28_4_ = fVar2;
          local_2460._0_4_ = fVar1 * *(float *)(uVar26 + 0x1c0);
          local_2460._4_4_ = fVar1 * *(float *)(uVar26 + 0x1c4);
          local_2460._8_4_ = fVar1 * *(float *)(uVar26 + 0x1c8);
          local_2460._12_4_ = fVar1 * *(float *)(uVar26 + 0x1cc);
          local_2460._16_4_ = fVar1 * *(float *)(uVar26 + 0x1d0);
          local_2460._20_4_ = fVar1 * *(float *)(uVar26 + 0x1d4);
          local_2460._24_4_ = fVar1 * *(float *)(uVar26 + 0x1d8);
          local_2460._28_4_ = 0;
          auVar5._4_4_ = fStack_251c * auVar10._4_4_;
          auVar5._0_4_ = local_2520 * auVar10._0_4_;
          auVar5._8_4_ = fStack_2518 * auVar10._8_4_;
          auVar5._12_4_ = fStack_2514 * auVar10._12_4_;
          auVar5._16_4_ = fStack_2510 * auVar10._16_4_;
          auVar5._20_4_ = fStack_250c * auVar10._20_4_;
          auVar5._24_4_ = fStack_2508 * auVar10._24_4_;
          auVar5._28_4_ = 0;
          auVar48._0_4_ = local_2520 * auVar11._0_4_;
          auVar48._4_4_ = fStack_251c * auVar11._4_4_;
          auVar48._8_4_ = fStack_2518 * auVar11._8_4_;
          auVar48._12_4_ = fStack_2514 * auVar11._12_4_;
          auVar48._16_4_ = fStack_2510 * auVar11._16_4_;
          auVar48._20_4_ = fStack_250c * auVar11._20_4_;
          auVar48._24_4_ = fStack_2508 * auVar11._24_4_;
          auVar48._28_4_ = 0;
          auVar23._4_4_ = uStack_24fc;
          auVar23._0_4_ = local_2500;
          auVar23._8_4_ = uStack_24f8;
          auVar23._12_4_ = uStack_24f4;
          auVar23._16_4_ = uStack_24f0;
          auVar23._20_4_ = uStack_24ec;
          auVar23._24_4_ = uStack_24e8;
          auVar23._28_4_ = uStack_24e4;
          auVar41 = vfmadd231ps_fma(auVar5,auVar23,local_2420);
          auVar44 = vfmadd231ps_fma(auVar48,auVar23,local_23c0);
          auVar24._4_4_ = uStack_24dc;
          auVar24._0_4_ = local_24e0;
          auVar24._8_4_ = uStack_24d8;
          auVar24._12_4_ = uStack_24d4;
          auVar24._16_4_ = uStack_24d0;
          auVar24._20_4_ = uStack_24cc;
          auVar24._24_4_ = uStack_24c8;
          auVar24._28_4_ = uStack_24c4;
          auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar24,local_2400);
          auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar24,local_23e0);
          auVar62._8_4_ = 0x7fffffff;
          auVar62._0_8_ = 0x7fffffff7fffffff;
          auVar62._12_4_ = 0x7fffffff;
          auVar62._16_4_ = 0x7fffffff;
          auVar62._20_4_ = 0x7fffffff;
          auVar62._24_4_ = 0x7fffffff;
          auVar62._28_4_ = 0x7fffffff;
          auVar5 = vandps_avx(auVar62,ZEXT1632(auVar41));
          auVar54._8_4_ = 0x219392ef;
          auVar54._0_8_ = 0x219392ef219392ef;
          auVar54._12_4_ = 0x219392ef;
          auVar54._16_4_ = 0x219392ef;
          auVar54._20_4_ = 0x219392ef;
          auVar54._24_4_ = 0x219392ef;
          auVar54._28_4_ = 0x219392ef;
          auVar5 = vcmpps_avx(auVar5,auVar54,1);
          auVar6 = vblendvps_avx(ZEXT1632(auVar41),auVar54,auVar5);
          auVar5 = vandps_avx(auVar62,ZEXT1632(auVar44));
          auVar5 = vcmpps_avx(auVar5,auVar54,1);
          auVar48 = vblendvps_avx(ZEXT1632(auVar44),auVar54,auVar5);
          auVar7._4_4_ = fStack_251c * auVar12._4_4_;
          auVar7._0_4_ = local_2520 * auVar12._0_4_;
          auVar7._8_4_ = fStack_2518 * auVar12._8_4_;
          auVar7._12_4_ = fStack_2514 * auVar12._12_4_;
          auVar7._16_4_ = fStack_2510 * auVar12._16_4_;
          auVar7._20_4_ = fStack_250c * auVar12._20_4_;
          auVar7._24_4_ = fStack_2508 * auVar12._24_4_;
          auVar7._28_4_ = auVar5._28_4_;
          auVar41 = vfmadd231ps_fma(auVar7,auVar23,local_2440);
          auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar24,*(undefined1 (*) [32])(uVar26 + 0x80))
          ;
          auVar5 = vandps_avx(auVar62,ZEXT1632(auVar41));
          auVar7 = vcmpps_avx(auVar5,auVar54,1);
          auVar5 = vblendvps_avx(ZEXT1632(auVar41),auVar54,auVar7);
          auVar9._4_4_ = fVar1 * *(float *)(uVar26 + 0x1e4);
          auVar9._0_4_ = fVar1 * *(float *)(uVar26 + 0x1e0);
          auVar9._8_4_ = fVar1 * *(float *)(uVar26 + 0x1e8);
          auVar9._12_4_ = fVar1 * *(float *)(uVar26 + 0x1ec);
          auVar9._16_4_ = fVar1 * *(float *)(uVar26 + 0x1f0);
          auVar9._20_4_ = fVar1 * *(float *)(uVar26 + 500);
          auVar9._24_4_ = fVar1 * *(float *)(uVar26 + 0x1f8);
          auVar9._28_4_ = fStack_2504;
          auVar8 = vfmadd231ps_fma(local_2460,auVar63,ZEXT832(0) << 0x20);
          auVar14 = vfmadd231ps_fma(auVar9,auVar63,ZEXT832(0) << 0x20);
          auVar17._4_4_ = fVar1 * *(float *)(uVar26 + 0x204);
          auVar17._0_4_ = fVar1 * *(float *)(uVar26 + 0x200);
          auVar17._8_4_ = fVar1 * *(float *)(uVar26 + 0x208);
          auVar17._12_4_ = fVar1 * *(float *)(uVar26 + 0x20c);
          auVar17._16_4_ = fVar1 * *(float *)(uVar26 + 0x210);
          auVar17._20_4_ = fVar1 * *(float *)(uVar26 + 0x214);
          auVar17._24_4_ = fVar1 * *(float *)(uVar26 + 0x218);
          auVar17._28_4_ = uStack_24e4;
          auVar15 = vfmadd231ps_fma(auVar17,auVar63,ZEXT832(0) << 0x20);
          auVar49._0_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x220);
          auVar49._4_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x224);
          auVar49._8_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x228);
          auVar49._12_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x22c);
          auVar49._16_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x230);
          auVar49._20_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x234);
          auVar49._24_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x238);
          auVar49._28_4_ = fVar2 + auVar7._28_4_;
          auVar47._0_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x240);
          auVar47._4_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x244);
          auVar47._8_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x248);
          auVar47._12_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x24c);
          auVar47._16_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x250);
          auVar47._20_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x254);
          auVar47._24_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 600);
          auVar47._28_4_ = fVar2 + 0.0;
          auVar7 = vrcpps_avx(auVar6);
          auVar64._0_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x260);
          auVar64._4_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x264);
          auVar64._8_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x268);
          auVar64._12_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x26c);
          auVar64._16_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x270);
          auVar64._20_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x274);
          auVar64._24_4_ = fVar2 + fVar1 * *(float *)(uVar26 + 0x278);
          auVar64._28_4_ = fVar2 + 0.0;
          auVar9 = vrcpps_avx(auVar48);
          auVar55._8_4_ = 0x3f800000;
          auVar55._0_8_ = &DAT_3f8000003f800000;
          auVar55._12_4_ = 0x3f800000;
          auVar55._16_4_ = 0x3f800000;
          auVar55._20_4_ = 0x3f800000;
          auVar55._24_4_ = 0x3f800000;
          auVar55._28_4_ = 0x3f800000;
          auVar41 = vfnmadd213ps_fma(auVar6,auVar7,auVar55);
          auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar7,auVar7);
          auVar44 = vfnmadd213ps_fma(auVar48,auVar9,auVar55);
          auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar9,auVar9);
          auVar6 = vrcpps_avx(auVar5);
          auVar45 = vfnmadd213ps_fma(auVar5,auVar6,auVar55);
          auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar6,auVar6);
          auVar6._4_4_ = fStack_24bc;
          auVar6._0_4_ = local_24c0;
          auVar6._8_4_ = fStack_24b8;
          auVar6._12_4_ = fStack_24b4;
          auVar6._16_4_ = fStack_24b0;
          auVar6._20_4_ = fStack_24ac;
          auVar6._24_4_ = fStack_24a8;
          auVar6._28_4_ = fStack_24a4;
          auVar42 = vfmadd213ps_fma(auVar10,auVar6,*(undefined1 (*) [32])(uVar26 + 0x160));
          auVar10._4_4_ = fStack_249c;
          auVar10._0_4_ = local_24a0;
          auVar10._8_4_ = fStack_2498;
          auVar10._12_4_ = fStack_2494;
          auVar10._16_4_ = fStack_2490;
          auVar10._20_4_ = fStack_248c;
          auVar10._24_4_ = fStack_2488;
          auVar10._28_4_ = fStack_2484;
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar10,local_2420);
          auVar56 = ZEXT3264(local_25c0);
          auVar42 = vfmadd213ps_fma(auVar11,auVar6,*(undefined1 (*) [32])(uVar26 + 0x180));
          auVar46 = vfmadd213ps_fma(auVar12,auVar6,*(undefined1 (*) [32])(uVar26 + 0x1a0));
          auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar10,local_23c0);
          auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar10,local_2440);
          auVar11._4_4_ = fStack_247c;
          auVar11._0_4_ = local_2480;
          auVar11._8_4_ = fStack_2478;
          auVar11._12_4_ = fStack_2474;
          auVar11._16_4_ = fStack_2470;
          auVar11._20_4_ = fStack_246c;
          auVar11._24_4_ = fStack_2468;
          auVar11._28_4_ = fStack_2464;
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar11,local_2400);
          auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar11,local_23e0);
          auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar11,*(undefined1 (*) [32])(uVar26 + 0x80))
          ;
          auVar10 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar16));
          auVar53 = ZEXT3264(local_25a0);
          auVar11 = vsubps_avx(auVar49,ZEXT1632(auVar16));
          auVar12 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar42));
          auVar5 = vsubps_avx(auVar47,ZEXT1632(auVar42));
          auVar6 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar46));
          auVar48 = vsubps_avx(auVar64,ZEXT1632(auVar46));
          auVar18._4_4_ = auVar41._4_4_ * auVar10._4_4_;
          auVar18._0_4_ = auVar41._0_4_ * auVar10._0_4_;
          auVar18._8_4_ = auVar41._8_4_ * auVar10._8_4_;
          auVar18._12_4_ = auVar41._12_4_ * auVar10._12_4_;
          auVar18._16_4_ = auVar10._16_4_ * 0.0;
          auVar18._20_4_ = auVar10._20_4_ * 0.0;
          auVar18._24_4_ = auVar10._24_4_ * 0.0;
          auVar18._28_4_ = auVar10._28_4_;
          auVar19._4_4_ = auVar41._4_4_ * auVar11._4_4_;
          auVar19._0_4_ = auVar41._0_4_ * auVar11._0_4_;
          auVar19._8_4_ = auVar41._8_4_ * auVar11._8_4_;
          auVar19._12_4_ = auVar41._12_4_ * auVar11._12_4_;
          auVar19._16_4_ = auVar11._16_4_ * 0.0;
          auVar19._20_4_ = auVar11._20_4_ * 0.0;
          auVar19._24_4_ = auVar11._24_4_ * 0.0;
          auVar19._28_4_ = auVar11._28_4_;
          auVar58 = ZEXT3264(local_25e0);
          auVar20._4_4_ = auVar44._4_4_ * auVar12._4_4_;
          auVar20._0_4_ = auVar44._0_4_ * auVar12._0_4_;
          auVar20._8_4_ = auVar44._8_4_ * auVar12._8_4_;
          auVar20._12_4_ = auVar44._12_4_ * auVar12._12_4_;
          auVar20._16_4_ = auVar12._16_4_ * 0.0;
          auVar20._20_4_ = auVar12._20_4_ * 0.0;
          auVar20._24_4_ = auVar12._24_4_ * 0.0;
          auVar20._28_4_ = auVar12._28_4_;
          auVar12._4_4_ = auVar45._4_4_ * auVar6._4_4_;
          auVar12._0_4_ = auVar45._0_4_ * auVar6._0_4_;
          auVar12._8_4_ = auVar45._8_4_ * auVar6._8_4_;
          auVar12._12_4_ = auVar45._12_4_ * auVar6._12_4_;
          auVar12._16_4_ = auVar6._16_4_ * 0.0;
          auVar12._20_4_ = auVar6._20_4_ * 0.0;
          auVar12._24_4_ = auVar6._24_4_ * 0.0;
          auVar12._28_4_ = auVar6._28_4_;
          auVar21._4_4_ = auVar44._4_4_ * auVar5._4_4_;
          auVar21._0_4_ = auVar44._0_4_ * auVar5._0_4_;
          auVar21._8_4_ = auVar44._8_4_ * auVar5._8_4_;
          auVar21._12_4_ = auVar44._12_4_ * auVar5._12_4_;
          auVar21._16_4_ = auVar5._16_4_ * 0.0;
          auVar21._20_4_ = auVar5._20_4_ * 0.0;
          auVar21._24_4_ = auVar5._24_4_ * 0.0;
          auVar21._28_4_ = auVar5._28_4_;
          auVar60 = ZEXT3264(local_2600);
          auVar22._4_4_ = auVar45._4_4_ * auVar48._4_4_;
          auVar22._0_4_ = auVar45._0_4_ * auVar48._0_4_;
          auVar22._8_4_ = auVar45._8_4_ * auVar48._8_4_;
          auVar22._12_4_ = auVar45._12_4_ * auVar48._12_4_;
          auVar22._16_4_ = auVar48._16_4_ * 0.0;
          auVar22._20_4_ = auVar48._20_4_ * 0.0;
          auVar22._24_4_ = auVar48._24_4_ * 0.0;
          auVar22._28_4_ = auVar48._28_4_;
          auVar10 = vpminsd_avx2(auVar20,auVar21);
          auVar11 = vpminsd_avx2(auVar12,auVar22);
          auVar10 = vmaxps_avx(auVar10,auVar11);
          auVar6 = vpminsd_avx2(auVar18,auVar19);
          auVar5 = vpmaxsd_avx2(auVar18,auVar19);
          auVar11 = vpmaxsd_avx2(auVar20,auVar21);
          auVar50 = ZEXT3264(local_2540);
          auVar12 = vpmaxsd_avx2(auVar12,auVar22);
          auVar12 = vminps_avx(auVar11,auVar12);
          auVar11 = vmaxps_avx(local_25a0,auVar6);
          auVar52 = ZEXT3264(local_2580);
          local_2620 = vmaxps_avx(auVar11,auVar10);
          auVar51 = ZEXT3264(local_2560);
          auVar10 = vminps_avx(auVar40._0_32_,auVar5);
          auVar10 = vminps_avx(auVar10,auVar12);
          auVar10 = vcmpps_avx(local_2620,auVar10,2);
          uVar39 = vmovmskps_avx(auVar10);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar39);
        }
        else {
          auVar43._4_4_ = fVar1;
          auVar43._0_4_ = fVar1;
          auVar43._8_4_ = fVar1;
          auVar43._12_4_ = fVar1;
          auVar43._16_4_ = fVar1;
          auVar43._20_4_ = fVar1;
          auVar43._24_4_ = fVar1;
          auVar43._28_4_ = fVar1;
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar35),auVar43,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + uVar35));
          auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar50._0_32_,auVar56._0_32_);
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar38),auVar43,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + uVar38));
          auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar51._0_32_,auVar58._0_32_);
          auVar10 = vpmaxsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar44));
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar29),auVar43,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + uVar29));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + (uVar35 ^ 0x20)),auVar43
                                    ,*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar35 ^ 0x20)));
          auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar50._0_32_,auVar56._0_32_);
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + (uVar38 ^ 0x20)),auVar43
                                    ,*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar38 ^ 0x20)));
          auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar51._0_32_,auVar58._0_32_);
          auVar12 = vpminsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar45));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + (uVar29 ^ 0x20)),auVar43
                                    ,*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar29 ^ 0x20)));
          auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar52._0_32_,auVar60._0_32_);
          auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar52._0_32_,auVar60._0_32_);
          auVar11 = vpmaxsd_avx2(ZEXT1632(auVar41),auVar53._0_32_);
          local_2620 = vpmaxsd_avx2(auVar10,auVar11);
          auVar10 = vpminsd_avx2(ZEXT1632(auVar44),auVar40._0_32_);
          auVar10 = vpminsd_avx2(auVar12,auVar10);
          auVar10 = vcmpps_avx(local_2620,auVar10,2);
          if (uVar27 == 6) {
            auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar26 + 0x1c0),auVar43,2);
            auVar12 = vcmpps_avx(auVar43,*(undefined1 (*) [32])(uVar26 + 0x1e0),1);
            auVar11 = vandps_avx(auVar11,auVar12);
            auVar10 = vandps_avx(auVar11,auVar10);
            auVar41 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          }
          else {
            auVar41 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          }
          auVar41 = vpsllw_avx(auVar41,0xf);
          auVar41 = vpacksswb_avx(auVar41,auVar41);
          unaff_R15 = (ulong)(byte)(SUB161(auVar41 >> 7,0) & 1 | (SUB161(auVar41 >> 0xf,0) & 1) << 1
                                    | (SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar41 >> 0x3f,0) << 7);
        }
      }
      if ((uVar34 & 8) == 0) {
        if (unaff_R15 == 0) {
          iVar25 = 4;
        }
        else {
          uVar26 = uVar34 & 0xfffffffffffffff0;
          lVar28 = 0;
          for (uVar34 = unaff_R15; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          iVar25 = 0;
          uVar31 = unaff_R15 - 1 & unaff_R15;
          uVar34 = *(ulong *)(uVar26 + lVar28 * 8);
          if (uVar31 != 0) {
            uVar27 = *(uint *)(local_2620 + lVar28 * 4);
            lVar28 = 0;
            for (uVar13 = uVar31; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar13 = *(ulong *)(uVar26 + lVar28 * 8);
            uVar4 = *(uint *)(local_2620 + lVar28 * 4);
            if (uVar31 == 0) {
              if (uVar27 < uVar4) {
                *(ulong *)*pauVar36 = uVar13;
                *(uint *)(*pauVar36 + 8) = uVar4;
                pauVar36 = pauVar36 + 1;
              }
              else {
                *(ulong *)*pauVar36 = uVar34;
                *(uint *)(*pauVar36 + 8) = uVar27;
                uVar34 = uVar13;
                pauVar36 = pauVar36 + 1;
              }
            }
            else {
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar34;
              auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar27));
              auVar44._8_8_ = 0;
              auVar44._0_8_ = uVar13;
              auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar4));
              lVar28 = 0;
              for (uVar34 = uVar31; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                lVar28 = lVar28 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = *(ulong *)(uVar26 + lVar28 * 8);
              auVar42 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_2620 + lVar28 * 4)));
              auVar45 = vpcmpgtd_avx(auVar44,auVar41);
              if (uVar31 == 0) {
                auVar46 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar44,auVar41,auVar46);
                auVar41 = vblendvps_avx(auVar41,auVar44,auVar46);
                auVar44 = vpcmpgtd_avx(auVar42,auVar45);
                auVar46 = vpshufd_avx(auVar44,0xaa);
                auVar44 = vblendvps_avx(auVar42,auVar45,auVar46);
                auVar45 = vblendvps_avx(auVar45,auVar42,auVar46);
                auVar42 = vpcmpgtd_avx(auVar45,auVar41);
                auVar46 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar45,auVar41,auVar46);
                auVar41 = vblendvps_avx(auVar41,auVar45,auVar46);
                *pauVar36 = auVar41;
                pauVar36[1] = auVar42;
                uVar34 = auVar44._0_8_;
                pauVar36 = pauVar36 + 2;
              }
              else {
                lVar28 = 0;
                for (uVar34 = uVar31; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  lVar28 = lVar28 + 1;
                }
                uVar31 = uVar31 - 1 & uVar31;
                auVar46._8_8_ = 0;
                auVar46._0_8_ = *(ulong *)(uVar26 + lVar28 * 8);
                auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_2620 + lVar28 * 4)));
                if (uVar31 == 0) {
                  auVar8 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar44,auVar41,auVar8);
                  auVar41 = vblendvps_avx(auVar41,auVar44,auVar8);
                  auVar44 = vpcmpgtd_avx(auVar46,auVar42);
                  auVar8 = vpshufd_avx(auVar44,0xaa);
                  auVar44 = vblendvps_avx(auVar46,auVar42,auVar8);
                  auVar42 = vblendvps_avx(auVar42,auVar46,auVar8);
                  auVar46 = vpcmpgtd_avx(auVar42,auVar41);
                  auVar8 = vpshufd_avx(auVar46,0xaa);
                  auVar46 = vblendvps_avx(auVar42,auVar41,auVar8);
                  auVar41 = vblendvps_avx(auVar41,auVar42,auVar8);
                  auVar42 = vpcmpgtd_avx(auVar44,auVar45);
                  auVar8 = vpshufd_avx(auVar42,0xaa);
                  auVar42 = vblendvps_avx(auVar44,auVar45,auVar8);
                  auVar44 = vblendvps_avx(auVar45,auVar44,auVar8);
                  auVar45 = vpcmpgtd_avx(auVar46,auVar44);
                  auVar8 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar46,auVar44,auVar8);
                  auVar44 = vblendvps_avx(auVar44,auVar46,auVar8);
                  *pauVar36 = auVar41;
                  pauVar36[1] = auVar44;
                  pauVar36[2] = auVar45;
                  uVar34 = auVar42._0_8_;
                  pauVar37 = pauVar36 + 3;
                }
                else {
                  *pauVar36 = auVar41;
                  pauVar36[1] = auVar44;
                  pauVar36[2] = auVar42;
                  pauVar36[3] = auVar46;
                  lVar28 = 0x30;
                  do {
                    lVar32 = lVar28;
                    lVar28 = 0;
                    for (uVar34 = uVar31; (uVar34 & 1) == 0;
                        uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                      lVar28 = lVar28 + 1;
                    }
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = *(ulong *)(uVar26 + lVar28 * 8);
                    auVar41 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_2620 + lVar28 * 4)));
                    *(undefined1 (*) [16])(pauVar36[1] + lVar32) = auVar41;
                    uVar31 = uVar31 - 1 & uVar31;
                    lVar28 = lVar32 + 0x10;
                  } while (uVar31 != 0);
                  pauVar37 = (undefined1 (*) [16])(pauVar36[1] + lVar32);
                  if (lVar32 + 0x10 != 0) {
                    lVar28 = 0x10;
                    pauVar30 = pauVar36;
                    do {
                      auVar41 = pauVar30[1];
                      uVar27 = *(uint *)(pauVar30[1] + 8);
                      pauVar30 = pauVar30 + 1;
                      lVar32 = lVar28;
                      do {
                        if (uVar27 <= *(uint *)(pauVar36[-1] + lVar32 + 8)) {
                          pauVar33 = (undefined1 (*) [16])(*pauVar36 + lVar32);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar36 + lVar32) =
                             *(undefined1 (*) [16])(pauVar36[-1] + lVar32);
                        lVar32 = lVar32 + -0x10;
                        pauVar33 = pauVar36;
                      } while (lVar32 != 0);
                      *pauVar33 = auVar41;
                      lVar28 = lVar28 + 0x10;
                    } while (pauVar37 != pauVar30);
                  }
                  uVar34 = *(ulong *)*pauVar37;
                }
                auVar50 = ZEXT3264(local_2540);
                auVar51 = ZEXT3264(local_2560);
                auVar52 = ZEXT3264(local_2580);
                auVar53 = ZEXT3264(local_25a0);
                auVar56 = ZEXT3264(local_25c0);
                auVar58 = ZEXT3264(local_25e0);
                auVar60 = ZEXT3264(local_2600);
                pauVar36 = pauVar37;
                iVar25 = 0;
              }
            }
          }
        }
      }
      else {
        iVar25 = 6;
      }
    } while (iVar25 == 0);
    if (iVar25 == 6) {
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(uVar34 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
      auVar60 = ZEXT3264(local_2600);
      auVar58 = ZEXT3264(local_25e0);
      auVar56 = ZEXT3264(local_25c0);
      auVar53 = ZEXT3264(local_25a0);
      auVar52 = ZEXT3264(local_2580);
      auVar51 = ZEXT3264(local_2560);
      auVar50 = ZEXT3264(local_2540);
      uVar39 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar40 = ZEXT3264(CONCAT428(uVar39,CONCAT424(uVar39,CONCAT420(uVar39,CONCAT416(uVar39,
                                                  CONCAT412(uVar39,CONCAT48(uVar39,CONCAT44(uVar39,
                                                  uVar39))))))));
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }